

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O3

compare_eq_result_container<QList<QNetworkCookie>,_QNetworkCookie> __thiscall
QList<QNetworkCookie>::operator==(QList<QNetworkCookie> *this,QList<QNetworkCookie> *other)

{
  bool bVar1;
  QNetworkCookie *this_00;
  QNetworkCookie *other_00;
  long lVar2;
  
  lVar2 = (this->d).size;
  if (lVar2 != (other->d).size) {
    return false;
  }
  this_00 = (this->d).ptr;
  other_00 = (other->d).ptr;
  bVar1 = true;
  if ((this_00 != other_00) && (lVar2 != 0)) {
    lVar2 = lVar2 * 8;
    do {
      lVar2 = lVar2 + -8;
      bVar1 = QNetworkCookie::operator==(this_00,other_00);
      if (!bVar1) {
        return bVar1;
      }
      this_00 = this_00 + 1;
      other_00 = other_00 + 1;
    } while (lVar2 != 0);
  }
  return bVar1;
}

Assistant:

constexpr qsizetype size() const noexcept
    {
#if __has_cpp_attribute(assume)
        constexpr size_t MaxSize = maxSize();
        [[assume(size_t(d.size) <= MaxSize)]];
#endif
        return d.size;
    }